

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5yy_shift(fts5yyParser *fts5yypParser,uchar fts5yyNewState,uchar fts5yyMajor,
                 Fts5Token fts5yyMinor)

{
  long lVar1;
  fts5yyParser *fts5yypParser_00;
  Fts5Parse *in_RCX;
  undefined1 in_DL;
  byte in_SIL;
  long *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  fts5yyStackEntry *fts5yytos;
  byte local_21;
  undefined4 uStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = *in_RDI + 0x18;
  fts5yypParser_00 = (fts5yyParser *)*in_RDI;
  if ((fts5yyParser *)in_RDI[2] < fts5yypParser_00) {
    *in_RDI = *in_RDI + -0x18;
    fts5yyStackOverflow(fts5yypParser_00);
  }
  else {
    local_21 = in_SIL;
    if (0x22 < in_SIL) {
      local_21 = in_SIL + 0x1f;
    }
    *(byte *)&fts5yypParser_00->fts5yytos = local_21;
    *(undefined1 *)((long)&fts5yypParser_00->fts5yytos + 1) = in_DL;
    fts5yypParser_00->pParse = in_RCX;
    fts5yypParser_00->fts5yystackEnd = (fts5yyStackEntry *)CONCAT44(uStack_c,in_R8D);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts5yy_shift(
  fts5yyParser *fts5yypParser,          /* The parser to be shifted */
  fts5YYACTIONTYPE fts5yyNewState,      /* The new state to shift in */
  fts5YYCODETYPE fts5yyMajor,           /* The major token to shift in */
  sqlite3Fts5ParserFTS5TOKENTYPE fts5yyMinor        /* The minor token to shift in */
){
  fts5yyStackEntry *fts5yytos;
  fts5yypParser->fts5yytos++;
#ifdef fts5YYTRACKMAXSTACKDEPTH
  if( (int)(fts5yypParser->fts5yytos - fts5yypParser->fts5yystack)>fts5yypParser->fts5yyhwm ){
    fts5yypParser->fts5yyhwm++;
    assert( fts5yypParser->fts5yyhwm == (int)(fts5yypParser->fts5yytos - fts5yypParser->fts5yystack) );
  }
#endif
  fts5yytos = fts5yypParser->fts5yytos;
  if( fts5yytos>fts5yypParser->fts5yystackEnd ){
    if( fts5yyGrowStack(fts5yypParser) ){
      fts5yypParser->fts5yytos--;
      fts5yyStackOverflow(fts5yypParser);
      return;
    }
    fts5yytos = fts5yypParser->fts5yytos;
    assert( fts5yytos <= fts5yypParser->fts5yystackEnd );
  }
  if( fts5yyNewState > fts5YY_MAX_SHIFT ){
    fts5yyNewState += fts5YY_MIN_REDUCE - fts5YY_MIN_SHIFTREDUCE;
  }
  fts5yytos->stateno = fts5yyNewState;
  fts5yytos->major = fts5yyMajor;
  fts5yytos->minor.fts5yy0 = fts5yyMinor;
  fts5yyTraceShift(fts5yypParser, fts5yyNewState, "Shift");
}